

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall
IlmThread_2_5::anon_unknown_5::DefaultThreadPoolProvider::addTask
          (DefaultThreadPoolProvider *this,Task *task)

{
  bool bVar1;
  Semaphore *in_RSI;
  Data *in_RDI;
  Lock taskLock;
  bool doPush;
  Mutex *in_stack_ffffffffffffffc8;
  Lock *in_stack_ffffffffffffffd0;
  
  bVar1 = std::atomic<bool>::load
                    ((atomic<bool> *)in_stack_ffffffffffffffc8,(memory_order)((ulong)in_RDI >> 0x20)
                    );
  if (bVar1) {
    Lock::Lock(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,SUB81((ulong)in_RDI >> 0x38,0));
    std::vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>::push_back
              ((vector<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_> *)
               in_stack_ffffffffffffffd0,(value_type *)in_stack_ffffffffffffffc8);
    Lock::~Lock((Lock *)in_RDI);
    Semaphore::post(in_RSI);
  }
  else {
    (*in_RSI->_vptr_Semaphore[2])();
    Task::group((Task *)in_RSI);
    TaskGroup::Data::removeTask(in_RDI);
    if (in_RSI != (Semaphore *)0x0) {
      (*in_RSI->_vptr_Semaphore[1])();
    }
  }
  return;
}

Assistant:

void
DefaultThreadPoolProvider::addTask (Task *task)
{
    //
    // Lock the threads, needed to access numThreads
    //
#ifdef ILMBASE_FORCE_CXX03
    bool doPush;
    {
        Lock lock (_data.threadMutex);
        doPush = !_data.threads.empty();
    }
#else
    bool doPush = _data.hasThreads.load( std::memory_order_relaxed );
#endif

    if ( doPush )
    {
        //
        // Get exclusive access to the tasks queue
        //

        {
            Lock taskLock (_data.taskMutex);

            //
            // Push the new task into the FIFO
            //
            _data.tasks.push_back (task);
        }
        
        //
        // Signal that we have a new task to process
        //
        _data.taskSemaphore.post ();
    }
    else
    {
        // this path shouldn't normally happen since we have the
        // NullThreadPoolProvider, but just in case...
        task->execute ();
        task->group()->_data->removeTask ();
        delete task;
    }
}